

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<capnp::SchemaFile::DiskSchemaFile> __thiscall
kj::
heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
          (kj *this,ReadableDirectory *params,Path *params_1,
          ArrayPtr<const_kj::ReadableDirectory_*const> *params_2,
          Own<const_kj::ReadableFile> *params_3,Maybe<kj::String> *params_4)

{
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath;
  ReadableFile *pRVar1;
  String *pSVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  kj *pkVar6;
  DiskSchemaFile *pDVar7;
  DiskSchemaFile *extraout_RDX;
  DiskSchemaFile *extraout_RDX_00;
  DiskSchemaFile *extraout_RDX_01;
  DiskSchemaFile *extraout_RDX_02;
  Own<capnp::SchemaFile::DiskSchemaFile> OVar8;
  Own<const_kj::ReadableFile> local_88;
  Path local_78;
  Maybe<kj::String> local_58;
  kj *local_38;
  
  local_38 = this;
  pDVar7 = (DiskSchemaFile *)operator_new(0x68);
  local_78.parts.ptr = (params_1->parts).ptr;
  local_78.parts.size_ = (params_1->parts).size_;
  local_78.parts.disposer = (params_1->parts).disposer;
  (params_1->parts).ptr = (String *)0x0;
  (params_1->parts).size_ = 0;
  importPath = *params_2;
  local_88.disposer = params_3->disposer;
  local_88.ptr = params_3->ptr;
  params_3->ptr = (ReadableFile *)0x0;
  local_58.ptr.isSet = (params_4->ptr).isSet;
  if (local_58.ptr.isSet == true) {
    local_58.ptr.field_1.value.content.ptr = (params_4->ptr).field_1.value.content.ptr;
    local_58.ptr.field_1.value.content.size_ = (params_4->ptr).field_1.value.content.size_;
    local_58.ptr.field_1.value.content.disposer = (params_4->ptr).field_1.value.content.disposer;
    (params_4->ptr).field_1.value.content.ptr = (char *)0x0;
    (params_4->ptr).field_1.value.content.size_ = 0;
  }
  capnp::SchemaFile::DiskSchemaFile::DiskSchemaFile
            (pDVar7,params,&local_78,importPath,&local_88,&local_58);
  pkVar6 = local_38;
  uVar5 = local_58.ptr.field_1.value.content.size_;
  uVar4 = local_58.ptr.field_1.value.content.ptr;
  *(undefined8 **)local_38 = &_::HeapDisposer<capnp::SchemaFile::DiskSchemaFile>::instance;
  *(DiskSchemaFile **)(local_38 + 8) = pDVar7;
  pDVar7 = extraout_RDX;
  if ((local_58.ptr.isSet == true) && (local_58.ptr.field_1.value.content.ptr != (char *)0x0)) {
    local_58.ptr.field_1.value.content.ptr = (char *)0x0;
    local_58.ptr.field_1.value.content.size_ = 0;
    (**(local_58.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_58.ptr.field_1.value.content.disposer,uVar4,1,uVar5,uVar5,0);
    pDVar7 = extraout_RDX_00;
  }
  pRVar1 = local_88.ptr;
  if (local_88.ptr != (ReadableFile *)0x0) {
    local_88.ptr = (ReadableFile *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               (pRVar1->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar1->super_FsNode);
    pDVar7 = extraout_RDX_01;
  }
  sVar3 = local_78.parts.size_;
  pSVar2 = local_78.parts.ptr;
  if (local_78.parts.ptr != (String *)0x0) {
    local_78.parts.ptr = (String *)0x0;
    local_78.parts.size_ = 0;
    (**(local_78.parts.disposer)->_vptr_ArrayDisposer)
              (local_78.parts.disposer,pSVar2,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    pDVar7 = extraout_RDX_02;
  }
  OVar8.ptr = pDVar7;
  OVar8.disposer = (Disposer *)pkVar6;
  return OVar8;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}